

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetNumberOfMembers(MemoryObject *this)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t uVar1;
  int iVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  this_00 = this->variable_inst_->context_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  this_01 = (this_00->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  uVar1 = 0;
  if (this->variable_inst_->has_type_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(this->variable_inst_,0);
  }
  pTVar3 = analysis::TypeManager::GetType(this_01,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[0x20])(pTVar3);
  pTVar3 = *(Type **)(CONCAT44(extraout_var,iVar2) + 0x28);
  GetAccessIds(&local_40,this);
  pTVar3 = analysis::TypeManager::GetMemberType(this_01,pTVar3,&local_40);
  uVar1 = anon_unknown_0::GetNumberOfMembers(pTVar3,this_00);
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t CopyPropagateArrays::MemoryObject::GetNumberOfMembers() {
  IRContext* context = variable_inst_->context();
  analysis::TypeManager* type_mgr = context->get_type_mgr();

  const analysis::Type* type = type_mgr->GetType(variable_inst_->type_id());
  type = type->AsPointer()->pointee_type();

  std::vector<uint32_t> access_indices = GetAccessIds();
  type = type_mgr->GetMemberType(type, access_indices);

  return opt::GetNumberOfMembers(type, context);
}